

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

ptr __thiscall ThreadPool::threadfun(ThreadPool *this,ptr *arg)

{
  bool bVar1;
  element_type *peVar2;
  reference pvVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr pVar5;
  undefined1 local_80 [8];
  queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
  appenders;
  SP_Appender appender;
  ptr *arg_local;
  ptr *pool;
  
  std::shared_ptr<ThreadPool>::shared_ptr((shared_ptr<ThreadPool> *)this,arg);
  std::shared_ptr<Appender>::shared_ptr
            ((shared_ptr<Appender> *)
             &appenders.c.
              super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(nullptr_t)0x0);
  while (peVar2 = std::__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), (peVar2->m_isRunning & 1U) != 0) {
    peVar2 = std::__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    take((queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
          *)local_80,peVar2);
    while (bVar1 = std::
                   queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
                   ::empty((queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
                            *)local_80), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
               ::front((queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
                        *)local_80);
      std::shared_ptr<Appender>::operator=
                ((shared_ptr<Appender> *)
                 &appenders.c.
                  super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,pvVar3);
      std::
      queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
      ::pop((queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
             *)local_80);
      peVar4 = std::__shared_ptr_access<Appender,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Appender,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&appenders.c.
                            super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
      (**peVar4->_vptr_Appender)();
    }
    std::
    queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
    ::~queue((queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
              *)local_80);
  }
  std::shared_ptr<Appender>::~shared_ptr
            ((shared_ptr<Appender> *)
             &appenders.c.
              super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  pVar5.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar5.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr)pVar5.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ThreadPool::ptr ThreadPool::threadfun(ThreadPool::ptr arg)
{
	ThreadPool::ptr pool = static_cast<ThreadPool::ptr>(arg);
	SP_Appender appender=nullptr;
	while (pool->m_isRunning) {
		std::queue<SP_Appender> appenders= pool->take();
		while(!appenders.empty()) {
			appender=appenders.front();
			appenders.pop();
			appender->append();
		}
	}
	return pool;
}